

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfRelocator.cpp
# Opt level: O2

void __thiscall ElfRelocator::writeSymbols(ElfRelocator *this,SymbolData *symData)

{
  pointer pEVar1;
  pointer pEVar2;
  ElfRelocatorSymbol *sym;
  pointer pEVar3;
  ElfRelocatorFile *file;
  pointer pEVar4;
  
  pEVar1 = (this->files).super__Vector_base<ElfRelocatorFile,_std::allocator<ElfRelocatorFile>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pEVar4 = (this->files).
                super__Vector_base<ElfRelocatorFile,_std::allocator<ElfRelocatorFile>_>._M_impl.
                super__Vector_impl_data._M_start; pEVar4 != pEVar1; pEVar4 = pEVar4 + 1) {
    pEVar2 = (pEVar4->symbols).
             super__Vector_base<ElfRelocatorSymbol,_std::allocator<ElfRelocatorSymbol>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pEVar3 = (pEVar4->symbols).
                  super__Vector_base<ElfRelocatorSymbol,_std::allocator<ElfRelocatorSymbol>_>.
                  _M_impl.super__Vector_impl_data._M_start; pEVar3 != pEVar2; pEVar3 = pEVar3 + 1) {
      SymbolData::addLabel(symData,pEVar3->relocatedAddress,&pEVar3->name);
      if (pEVar3->type == 2) {
        SymbolData::startFunction(symData,pEVar3->relocatedAddress);
        SymbolData::endFunction(symData,pEVar3->size + pEVar3->relocatedAddress);
      }
      else if (pEVar3->type == 1) {
        SymbolData::addData(symData,pEVar3->relocatedAddress,pEVar3->size,Data8);
      }
    }
  }
  return;
}

Assistant:

void ElfRelocator::writeSymbols(SymbolData& symData) const
{
	for (const ElfRelocatorFile& file: files)
	{
		for (const ElfRelocatorSymbol& sym: file.symbols)
		{
			symData.addLabel(sym.relocatedAddress, sym.name);

			switch (sym.type)
			{
			case STT_OBJECT:
				symData.addData(sym.relocatedAddress,sym.size,SymbolData::Data8);
				break;
			case STT_FUNC:
				symData.startFunction(sym.relocatedAddress);
				symData.endFunction(sym.relocatedAddress+sym.size);
				break;
			}
		}
	}
}